

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

QIcon __thiscall
QFusionStyle::standardIcon
          (QFusionStyle *this,StandardPixmap standardIcon,QStyleOption *option,QWidget *widget)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QSize> local_58;
  QIcon icon;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  iconFromTheme((QFusionStyle *)&icon,standardIcon);
  QIcon::availableSizes((Mode)&local_58,(State)(QFusionStyle *)&icon);
  QArrayDataPointer<QSize>::~QArrayDataPointer(&local_58);
  if (local_58.size == 0) {
    QCommonStyle::standardIcon
              (&this->super_QCommonStyle,standardIcon,(QStyleOption *)((ulong)option & 0xffffffff),
               widget);
  }
  else {
    QIcon::QIcon((QIcon *)this,&icon);
  }
  QIcon::~QIcon(&icon);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QIcon)(QIconPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QFusionStyle::standardIcon(StandardPixmap standardIcon, const QStyleOption *option,
                                 const QWidget *widget) const
{
    const auto icon = iconFromTheme(standardIcon);
    if (!icon.availableSizes().isEmpty())
        return icon;
    return QCommonStyle::standardIcon(standardIcon, option, widget);
}